

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component_draw.cpp
# Opt level: O0

void anon_unknown.dwarf_621f7::materialize_gate
               (ComponentWidget *widget,float min_width,float min_height)

{
  float fVar1;
  ComponentWidget *pCVar2;
  uint32_t uVar3;
  float *pfVar4;
  uint *puVar5;
  pin_id_t pVar6;
  double dVar7;
  undefined1 extraout_var [12];
  undefined1 auVar8 [16];
  undefined1 extraout_var_00 [12];
  undefined1 auVar9 [16];
  Point local_70;
  Point local_68;
  Point local_60;
  Point local_58;
  Point local_50;
  Point local_48;
  float local_40;
  float local_3c;
  float h_height;
  float h_width;
  float local_30;
  float local_2c;
  float local_28;
  float height;
  ModelComponent *pMStack_20;
  float width;
  ModelComponent *model;
  float min_height_local;
  float min_width_local;
  ComponentWidget *widget_local;
  
  model._0_4_ = min_height;
  model._4_4_ = min_width;
  _min_height_local = widget;
  pMStack_20 = lsim::gui::ComponentWidget::component_model(widget);
  uVar3 = lsim::ModelComponent::num_controls(pMStack_20);
  auVar8._0_4_ = (float)(uVar3 + 1) * 0.5;
  auVar8._4_12_ = extraout_var;
  dVar7 = std::ceil(auVar8._0_8_);
  local_28 = SUB84(dVar7,0) * 10.0;
  pfVar4 = std::max<float>((float *)((long)&model + 4),&local_28);
  height = *pfVar4;
  h_width = (float)lsim::ModelComponent::num_inputs(pMStack_20);
  h_height = (float)lsim::ModelComponent::num_outputs(pMStack_20);
  puVar5 = std::max<unsigned_int>((uint *)&h_width,(uint *)&h_height);
  auVar9._0_4_ = (float)(*puVar5 + 1) / 2.0;
  auVar9._4_12_ = extraout_var_00;
  dVar7 = std::ceil(auVar9._0_8_);
  local_30 = SUB84(dVar7,0) * 20.0;
  pfVar4 = std::max<float>((float *)&model,&local_30);
  local_2c = *pfVar4;
  local_3c = height / 2.0;
  local_40 = local_2c / 2.0;
  lsim::gui::ComponentWidget::change_size(_min_height_local,height,local_2c);
  uVar3 = lsim::ModelComponent::num_inputs(pMStack_20);
  pCVar2 = _min_height_local;
  if (uVar3 != 0) {
    pVar6 = lsim::ModelComponent::input_pin_id(pMStack_20,0);
    uVar3 = lsim::ModelComponent::num_inputs(pMStack_20);
    fVar1 = local_2c;
    lsim::Point::Point(&local_48,-local_3c,0.0);
    lsim::Point::Point(&local_50,0.0,1.0);
    lsim::gui::ComponentWidget::add_pin_line(pCVar2,pVar6,(ulong)uVar3,fVar1,local_48,local_50);
  }
  uVar3 = lsim::ModelComponent::num_outputs(pMStack_20);
  pCVar2 = _min_height_local;
  if (uVar3 != 0) {
    pVar6 = lsim::ModelComponent::output_pin_id(pMStack_20,0);
    uVar3 = lsim::ModelComponent::num_outputs(pMStack_20);
    fVar1 = local_2c;
    lsim::Point::Point(&local_58,local_3c,0.0);
    lsim::Point::Point(&local_60,0.0,1.0);
    lsim::gui::ComponentWidget::add_pin_line(pCVar2,pVar6,(ulong)uVar3,fVar1,local_58,local_60);
  }
  uVar3 = lsim::ModelComponent::num_controls(pMStack_20);
  pCVar2 = _min_height_local;
  if (uVar3 != 0) {
    pVar6 = lsim::ModelComponent::control_pin_id(pMStack_20,0);
    uVar3 = lsim::ModelComponent::num_controls(pMStack_20);
    fVar1 = height;
    lsim::Point::Point(&local_68,0.0,-local_40);
    lsim::Point::Point(&local_70,1.0,0.0);
    lsim::gui::ComponentWidget::add_pin_line(pCVar2,pVar6,(ulong)uVar3,fVar1,local_68,local_70);
  }
  return;
}

Assistant:

void materialize_gate(ComponentWidget *widget, float min_width = 60, float min_height = 60) {

	auto model = widget->component_model();

	// size of component box depends on pin count
	const float width = std::max(min_width, 10.0f * std::ceil((model->num_controls() + 1) / 2.0f));
	const float height = std::max(min_height, 20.0f * (std::ceil((std::max(model->num_inputs(), model->num_outputs()) + 1) / 2.0f)));
	const float h_width = width / 2.0f;
	const float h_height = height / 2.0f;

	widget->change_size(width, height);

	// pins
	if (model->num_inputs() > 0) {
		widget->add_pin_line(model->input_pin_id(0), model->num_inputs(),
			height, { -h_width, 0 }, { 0, 1 });
	}
	if (model->num_outputs() > 0) {
		widget->add_pin_line(model->output_pin_id(0), model->num_outputs(),
			height, { h_width, 0 }, { 0, 1 });
	}
	if (model->num_controls() > 0) {
		widget->add_pin_line(model->control_pin_id(0), model->num_controls(),
			width, { 0, -h_height }, { 1, 0 });
	}
}